

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

int __thiscall cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  iterator *piVar1;
  pointer pLVar2;
  cmTarget *pcVar3;
  _Elt_pointer pBVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  iterator iVar9;
  long lVar10;
  char *pcVar11;
  DependSetList *pDVar12;
  _Rb_tree_color _Var13;
  pointer pLVar14;
  bool bVar15;
  BFSEntry qe;
  BFSEntry qe_1;
  string local_88;
  long local_68;
  BFSEntry local_60;
  long *local_50 [2];
  long local_40 [2];
  
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LinkEntryIndex)._M_t,&item->super_string);
  if ((_Rb_tree_header *)iVar8._M_node == &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar9 = AllocateLinkEntry(this,&item->super_string);
    _Var13 = iVar9._M_node[2]._M_color;
    lVar10 = (long)(int)_Var13;
    pLVar2 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar14 = pLVar2 + lVar10;
    local_68 = lVar10;
    std::__cxx11::string::_M_assign((string *)pLVar14);
    pcVar3 = item->Target;
    pLVar2[lVar10].Target = pcVar3;
    bVar6 = false;
    bVar15 = false;
    if (pcVar3 == (cmTarget *)0x0) {
      pcVar11 = (item->super_string)._M_dataplus._M_p;
      bVar6 = false;
      if ((*pcVar11 == '-') && (bVar6 = false, pcVar11[1] != 'l')) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)item);
        iVar7 = std::__cxx11::string::compare((char *)local_50);
        bVar15 = iVar7 != 0;
        bVar6 = true;
      }
    }
    pLVar14->IsFlag = bVar15;
    if ((bVar6) && (local_50[0] != local_40)) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (pLVar14->Target == (cmTarget *)0x0) {
      _Var5._M_p = (pLVar14->Item)._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,_Var5._M_p,_Var5._M_p + (pLVar14->Item)._M_string_length);
      std::__cxx11::string::append((char *)&local_88);
      pcVar11 = cmMakefile::GetDefinition(this->Makefile,&local_88);
      if (pcVar11 == (char *)0x0) {
        if (pLVar14->IsFlag == false) {
          pDVar12 = (DependSetList *)operator_new(0x18);
          *(undefined8 *)
           &(pDVar12->
            super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ).
            super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ._M_impl = 0;
          *(pointer *)
           ((long)&(pDVar12->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 8) = (pointer)0x0;
          *(pointer *)
           ((long)&(pDVar12->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 0x10) = (pointer)0x0;
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
          ._M_impl.super__Vector_impl_data._M_start[local_68] = pDVar12;
        }
      }
      else {
        pBVar4 = (this->BFSQueue).c.
                 super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_60.Index = _Var13;
        local_60.LibDepends = pcVar11;
        if (pBVar4 == (this->BFSQueue).c.
                      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
          ::_M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                    ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                      *)&this->BFSQueue,&local_60);
        }
        else {
          *(ulong *)pBVar4 = CONCAT44(local_60._4_4_,_Var13);
          pBVar4->LibDepends = pcVar11;
          piVar1 = &(this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_88._M_dataplus._M_p._0_4_ = _Var13;
      local_88._M_string_length = 0;
      pBVar4 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar4 == (this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>::
        _M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                  ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                    *)&this->BFSQueue,(BFSEntry *)&local_88);
      }
      else {
        *(pointer *)pBVar4 = local_88._M_dataplus._M_p;
        pBVar4->LibDepends = (char *)0x0;
        piVar1 = &(this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
  }
  else {
    _Var13 = iVar8._M_node[2]._M_color;
  }
  return _Var13;
}

Assistant:

int cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item)
{
  // Check if the item entry has already been added.
  std::map<std::string, int>::iterator lei = this->LinkEntryIndex.find(item);
  if(lei != this->LinkEntryIndex.end())
    {
    // Yes.  We do not need to follow the item's dependencies again.
    return lei->second;
    }

  // Allocate a spot for the item entry.
  lei = this->AllocateLinkEntry(item);

  // Initialize the item entry.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = item;
  entry.Target = item.Target;
  entry.IsFlag = (!entry.Target && item[0] == '-' && item[1] != 'l' &&
                  item.substr(0, 10) != "-framework");

  // If the item has dependencies queue it to follow them.
  if(entry.Target)
    {
    // Target dependencies are always known.  Follow them.
    BFSEntry qe = {index, 0};
    this->BFSQueue.push(qe);
    }
  else
    {
    // Look for an old-style <item>_LIB_DEPENDS variable.
    std::string var = entry.Item;
    var += "_LIB_DEPENDS";
    if(const char* val = this->Makefile->GetDefinition(var))
      {
      // The item dependencies are known.  Follow them.
      BFSEntry qe = {index, val};
      this->BFSQueue.push(qe);
      }
    else if(!entry.IsFlag)
      {
      // The item dependencies are not known.  We need to infer them.
      this->InferredDependSets[index] = new DependSetList;
      }
    }

  return index;
}